

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase181::run(TestCase181 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  bool bVar1;
  Builder *value;
  Reader *value_00;
  Builder *value_01;
  ArrayPtr<unsigned_char> AVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  undefined4 in_stack_ffffffffffffe720;
  undefined4 in_stack_ffffffffffffe724;
  ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> local_1750;
  Reader local_1720;
  Reader local_16f0;
  uint local_16bc [2];
  bool local_16b1;
  undefined1 local_16b0 [7];
  bool _kj_shouldLog_20;
  Reader local_1680;
  Reader local_1650;
  uint local_161c [2];
  DebugExpression<int> local_1614;
  undefined1 local_1610 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_20;
  Reader local_15c0;
  ArrayPtr<const_unsigned_char> local_1590;
  size_t local_1580;
  int local_1578;
  bool local_1571;
  undefined1 local_1570 [7];
  bool _kj_shouldLog_19;
  Reader local_1540;
  ArrayPtr<const_unsigned_char> local_1510;
  size_t local_1500;
  int local_14f8;
  DebugExpression<int> local_14f4;
  undefined1 local_14f0 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_19;
  bool local_14bd;
  uint local_14bc;
  int iStack_14b8;
  bool _kj_shouldLog_18;
  DebugExpression<int> local_14b4;
  undefined1 local_14b0 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_18;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_1478;
  Reader local_1450;
  undefined1 local_1420 [48];
  ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> local_13f0;
  Reader local_13c0;
  Reader local_1390;
  uint local_135c [2];
  bool local_1351;
  undefined1 local_1350 [7];
  bool _kj_shouldLog_17;
  Reader local_1320;
  Reader local_12f0;
  uint local_12bc [2];
  DebugExpression<int> local_12b4;
  undefined1 local_12b0 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_17;
  Reader local_1260;
  ArrayPtr<const_unsigned_char> local_1230;
  size_t local_1220;
  int local_1218;
  bool local_1211;
  undefined1 local_1210 [7];
  bool _kj_shouldLog_16;
  Reader local_11e0;
  ArrayPtr<const_unsigned_char> local_11b0;
  size_t local_11a0;
  int local_1198;
  DebugExpression<int> local_1194;
  undefined1 local_1190 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_16;
  bool local_115d;
  uint local_115c;
  int iStack_1158;
  bool _kj_shouldLog_15;
  DebugExpression<int> local_1154;
  undefined1 local_1150 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_15;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_1118;
  BuilderFor<AnyTypeFor<FromBuilder<Builder>_>_> local_10f0;
  undefined1 local_10c8 [48];
  ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> local_1098;
  Reader local_1068;
  Reader local_1038;
  uint local_1004 [2];
  bool local_ff9;
  undefined1 local_ff8 [7];
  bool _kj_shouldLog_14;
  Reader local_fc8;
  Reader local_f98;
  uint local_f64 [2];
  DebugExpression<int> local_f5c;
  undefined1 local_f58 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_14;
  Reader local_f08;
  ArrayPtr<const_unsigned_char> local_ed8;
  size_t local_ec8;
  int local_ec0;
  bool local_eb9;
  undefined1 local_eb8 [7];
  bool _kj_shouldLog_13;
  Reader local_e88;
  ArrayPtr<const_unsigned_char> local_e58;
  size_t local_e48;
  int local_e40;
  DebugExpression<int> local_e3c;
  undefined1 local_e38 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_13;
  bool local_e05;
  uint local_e04;
  int iStack_e00;
  bool _kj_shouldLog_12;
  DebugExpression<int> local_dfc;
  undefined1 local_df8 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_12;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_dc0;
  Reader local_d98;
  undefined1 auStack_d68 [8];
  ReaderFor<AnyTypeFor<FromReader<Reader>_>_> alr;
  BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> local_d30;
  Builder local_d08;
  Builder local_ce0;
  uint local_cb4 [2];
  bool local_ca9;
  undefined1 local_ca8 [7];
  bool _kj_shouldLog_11;
  Builder local_c80;
  Builder local_c58;
  uint local_c2c [2];
  DebugExpression<int> local_c24;
  undefined1 local_c20 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_11;
  Builder local_bd8;
  ArrayPtr<unsigned_char> local_bb0;
  size_t local_ba0;
  int local_b98;
  bool local_b91;
  undefined1 local_b90 [7];
  bool _kj_shouldLog_10;
  Builder local_b68;
  ArrayPtr<unsigned_char> local_b40;
  size_t local_b30;
  int local_b28;
  DebugExpression<int> local_b24;
  undefined1 local_b20 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_10;
  bool local_aed;
  uint local_aec;
  int iStack_ae8;
  bool _kj_shouldLog_9;
  DebugExpression<int> local_ae4;
  undefined1 local_ae0 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_9;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_aa8;
  undefined1 local_a80 [40];
  BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> local_a58;
  Builder local_a30;
  Builder local_a08;
  uint local_9dc [2];
  bool local_9d1;
  undefined1 local_9d0 [7];
  bool _kj_shouldLog_8;
  Builder local_9a8;
  Builder local_980;
  uint local_954 [2];
  DebugExpression<int> local_94c;
  undefined1 local_948 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_8;
  Builder local_900;
  ArrayPtr<unsigned_char> local_8d8;
  size_t local_8c8;
  int local_8c0;
  bool local_8b9;
  undefined1 local_8b8 [7];
  bool _kj_shouldLog_7;
  Builder local_890;
  ArrayPtr<unsigned_char> local_868;
  size_t local_858;
  int local_850;
  DebugExpression<int> local_84c;
  undefined1 local_848 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_7;
  bool local_815;
  uint local_814;
  int iStack_810;
  bool _kj_shouldLog_6;
  DebugExpression<int> local_80c;
  undefined1 local_808 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_6;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_7d0;
  undefined1 auStack_7a8 [8];
  BuilderFor<AnyTypeFor<FromBuilder<Builder>_>_> alb;
  ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> local_778;
  Reader local_748;
  Reader local_718;
  uint local_6e4 [2];
  bool local_6d9;
  undefined1 local_6d8 [7];
  bool _kj_shouldLog_5;
  Reader local_6a8;
  Reader local_678;
  uint local_644 [2];
  DebugExpression<int> local_63c;
  undefined1 local_638 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_5;
  Reader local_5e8;
  ArrayPtr<const_unsigned_char> local_5b8;
  size_t local_5a8;
  int local_5a0;
  bool local_599;
  undefined1 local_598 [7];
  bool _kj_shouldLog_4;
  Reader local_568;
  ArrayPtr<const_unsigned_char> local_538;
  size_t local_528;
  int local_520;
  DebugExpression<int> local_51c;
  undefined1 local_518 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_4;
  bool local_4e5;
  uint local_4e4;
  int iStack_4e0;
  bool _kj_shouldLog_3;
  DebugExpression<int> local_4dc;
  undefined1 local_4d8 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_3;
  Reader local_4a0;
  undefined1 local_480 [8];
  ReaderFor<capnp::AnyList> readPtr;
  Builder local_428;
  Builder local_400;
  uint local_3d4 [2];
  bool local_3c9;
  undefined1 local_3c8 [7];
  bool _kj_shouldLog_2;
  Builder local_3a0;
  Builder local_378;
  uint local_34c [2];
  DebugExpression<int> local_344;
  undefined1 local_340 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  Builder local_2f8;
  ArrayPtr<unsigned_char> local_2d0;
  size_t local_2c0;
  int local_2b8;
  bool local_2b1;
  undefined1 local_2b0 [7];
  bool _kj_shouldLog_1;
  Builder local_288;
  ArrayPtr<unsigned_char> local_260;
  size_t local_250;
  int local_248;
  DebugExpression<int> local_244;
  undefined1 local_240 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_1;
  bool local_20d;
  uint local_20c;
  int iStack_208;
  bool _kj_shouldLog;
  DebugExpression<int> local_204;
  undefined1 local_200 [8];
  DebugComparison<int,_unsigned_int> _kjCondition;
  undefined1 local_1c8 [8];
  BuilderFor<capnp::AnyList> ptr;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  Builder local_178;
  undefined1 local_160 [8];
  Builder b;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase181 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_178,(Builder *)local_128);
  AnyPointer::Builder::initAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_160,&local_178,2);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&ptr._builder.structDataSize,(Builder *)local_160,0);
  builder_00._builder.capTable = (CapTableBuilder *)local_190;
  builder_00._builder.segment = (SegmentBuilder *)uStack_198;
  builder_00._builder.data = (void *)uStack_188;
  builder_00._builder.pointers = (WirePointer *)local_180;
  builder_00._builder.dataSize = in_stack_ffffffffffffe720;
  builder_00._builder._36_4_ = in_stack_ffffffffffffe724;
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::AnyList>
            ((BuilderFor<capnp::AnyList> *)local_1c8,(Builder *)&_kjCondition.result);
  iStack_208 = 2;
  local_204 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffdf8);
  local_20c = AnyList::Builder::size((Builder *)local_1c8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_200,&local_204,&local_20c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
  if (!bVar1) {
    local_20d = kj::_::Debug::shouldLog(ERROR);
    while (local_20d != false) {
      _kjCondition_1._36_4_ = 2;
      _kjCondition_1._32_4_ = AnyList::Builder::size((Builder *)local_1c8);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xbd,ERROR,
                 "\"failed: expected \" \"(2) == (ptr.size())\", _kjCondition, 2, ptr.size()",
                 (char (*) [37])"failed: expected (2) == (ptr.size())",
                 (DebugComparison<int,_unsigned_int> *)local_200,(int *)&_kjCondition_1.field_0x24,
                 (uint *)&_kjCondition_1.result);
      local_20d = false;
    }
  }
  local_248 = 0x30;
  local_244 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_248);
  AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_2b0,(Builder *)local_1c8);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[](&local_288,(Builder *)local_2b0,0);
  local_260 = AnyStruct::Builder::getDataSection(&local_288);
  local_250 = kj::ArrayPtr<unsigned_char>::size(&local_260);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_240,&local_244,&local_250);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_240);
  if (!bVar1) {
    local_2b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2b1 != false) {
      local_2b8 = 0x30;
      AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&_kjCondition_2.result,
                 (Builder *)local_1c8);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[]
                (&local_2f8,(Builder *)&_kjCondition_2.result,0);
      AVar2 = AnyStruct::Builder::getDataSection(&local_2f8);
      local_2d0 = AVar2;
      local_2c0 = kj::ArrayPtr<unsigned_char>::size(&local_2d0);
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xbe,ERROR,
                 "\"failed: expected \" \"(48) == (ptr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, ptr.as<List<AnyStruct>>()[0].getDataSection().size()"
                 ,(char (*) [80])
                  "failed: expected (48) == (ptr.as<List<AnyStruct>>()[0].getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_240,&local_2b8,&local_2c0);
      local_2b1 = false;
    }
  }
  local_34c[1] = 0x14;
  local_344 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_34c + 1));
  AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_3c8,(Builder *)local_1c8);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[](&local_3a0,(Builder *)local_3c8,0);
  AnyStruct::Builder::getPointerSection(&local_378,&local_3a0);
  local_34c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_378);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_340,&local_344,local_34c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_340);
  if (!bVar1) {
    local_3c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c9 != false) {
      local_3d4[1] = 0x14;
      AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&readPtr._reader.nestingLimit,
                 (Builder *)local_1c8);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[]
                (&local_428,(Builder *)&readPtr._reader.nestingLimit,0);
      AnyStruct::Builder::getPointerSection(&local_400,&local_428);
      local_3d4[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_400);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xbf,ERROR,
                 "\"failed: expected \" \"(20) == (ptr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, ptr.as<List<AnyStruct>>()[0].getPointerSection().size()"
                 ,(char (*) [83])
                  "failed: expected (20) == (ptr.as<List<AnyStruct>>()[0].getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_340,(int *)(local_3d4 + 1),local_3d4);
      local_3c9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_3.result,(Builder *)local_128);
  AnyPointer::Builder::asReader(&local_4a0,(Builder *)&_kjCondition_3.result);
  AnyPointer::Reader::getAs<capnp::AnyList>((ReaderFor<capnp::AnyList> *)local_480,&local_4a0);
  iStack_4e0 = 2;
  local_4dc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffb20);
  local_4e4 = AnyList::Reader::size((Reader *)local_480);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_4d8,&local_4dc,&local_4e4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4d8);
  if (!bVar1) {
    local_4e5 = kj::_::Debug::shouldLog(ERROR);
    while (local_4e5 != false) {
      _kjCondition_4._36_4_ = 2;
      _kjCondition_4._32_4_ = AnyList::Reader::size((Reader *)local_480);
      kj::_::Debug::
      log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xc3,ERROR,
                 "\"failed: expected \" \"(2) == (readPtr.size())\", _kjCondition, 2, readPtr.size()"
                 ,(char (*) [41])"failed: expected (2) == (readPtr.size())",
                 (DebugComparison<int,_unsigned_int> *)local_4d8,(int *)&_kjCondition_4.field_0x24,
                 (uint *)&_kjCondition_4.result);
      local_4e5 = false;
    }
  }
  local_520 = 0x30;
  local_51c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_520);
  AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_598,(Reader *)local_480);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_568,(Reader *)local_598,0);
  local_538 = AnyStruct::Reader::getDataSection(&local_568);
  local_528 = kj::ArrayPtr<const_unsigned_char>::size(&local_538);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_518,&local_51c,&local_528);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_518);
  if (!bVar1) {
    local_599 = kj::_::Debug::shouldLog(ERROR);
    while (local_599 != false) {
      local_5a0 = 0x30;
      AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&_kjCondition_5.result,
                 (Reader *)local_480);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[]
                (&local_5e8,(Reader *)&_kjCondition_5.result,0);
      AVar3 = AnyStruct::Reader::getDataSection(&local_5e8);
      local_5b8 = AVar3;
      local_5a8 = kj::ArrayPtr<const_unsigned_char>::size(&local_5b8);
      kj::_::Debug::
      log<char_const(&)[84],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xc4,ERROR,
                 "\"failed: expected \" \"(48) == (readPtr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, readPtr.as<List<AnyStruct>>()[0].getDataSection().size()"
                 ,(char (*) [84])
                  "failed: expected (48) == (readPtr.as<List<AnyStruct>>()[0].getDataSection().size())"
                 ,(DebugComparison<int,_unsigned_long> *)local_518,&local_5a0,&local_5a8);
      local_599 = false;
    }
  }
  local_644[1] = 0x14;
  local_63c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_644 + 1));
  AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_6d8,(Reader *)local_480);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_6a8,(Reader *)local_6d8,0);
  AnyStruct::Reader::getPointerSection(&local_678,&local_6a8);
  local_644[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_678);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_638,&local_63c,local_644);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_638);
  if (!bVar1) {
    local_6d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6d9 != false) {
      local_6e4[1] = 0x14;
      AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                (&local_778,(Reader *)local_480);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_748,&local_778,0);
      AnyStruct::Reader::getPointerSection(&local_718,&local_748);
      local_6e4[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_718);
      kj::_::Debug::
      log<char_const(&)[87],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xc5,ERROR,
                 "\"failed: expected \" \"(20) == (readPtr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, readPtr.as<List<AnyStruct>>()[0].getPointerSection().size()"
                 ,(char (*) [87])
                  "failed: expected (20) == (readPtr.as<List<AnyStruct>>()[0].getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_638,(int *)(local_6e4 + 1),local_6e4);
      local_6d9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_6.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            (&local_7d0,(Builder *)&_kjCondition_6.result);
  toAny<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>::Builder>
            ((BuilderFor<AnyTypeFor<FromBuilder<Builder>_>_> *)auStack_7a8,(capnp *)&local_7d0,value
            );
  iStack_810 = 2;
  local_80c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff7f0);
  local_814 = AnyList::Builder::size((Builder *)auStack_7a8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_808,&local_80c,&local_814);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_808);
  if (!bVar1) {
    local_815 = kj::_::Debug::shouldLog(ERROR);
    while (local_815 != false) {
      _kjCondition_7._36_4_ = 2;
      _kjCondition_7._32_4_ = AnyList::Builder::size((Builder *)auStack_7a8);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,200,ERROR,
                 "\"failed: expected \" \"(2) == (alb.size())\", _kjCondition, 2, alb.size()",
                 (char (*) [37])"failed: expected (2) == (alb.size())",
                 (DebugComparison<int,_unsigned_int> *)local_808,(int *)&_kjCondition_7.field_0x24,
                 (uint *)&_kjCondition_7.result);
      local_815 = false;
    }
  }
  local_850 = 0x30;
  local_84c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_850);
  AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_8b8,(Builder *)auStack_7a8);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[](&local_890,(Builder *)local_8b8,0);
  local_868 = AnyStruct::Builder::getDataSection(&local_890);
  local_858 = kj::ArrayPtr<unsigned_char>::size(&local_868);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_848,&local_84c,&local_858);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_848);
  if (!bVar1) {
    local_8b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_8b9 != false) {
      local_8c0 = 0x30;
      AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&_kjCondition_8.result,
                 (Builder *)auStack_7a8);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[]
                (&local_900,(Builder *)&_kjCondition_8.result,0);
      AVar2 = AnyStruct::Builder::getDataSection(&local_900);
      local_8d8 = AVar2;
      local_8c8 = kj::ArrayPtr<unsigned_char>::size(&local_8d8);
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xc9,ERROR,
                 "\"failed: expected \" \"(48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alb.as<List<AnyStruct>>()[0].getDataSection().size()"
                 ,(char (*) [80])
                  "failed: expected (48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_848,&local_8c0,&local_8c8);
      local_8b9 = false;
    }
  }
  local_954[1] = 0x14;
  local_94c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_954 + 1));
  AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_9d0,(Builder *)auStack_7a8);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[](&local_9a8,(Builder *)local_9d0,0);
  AnyStruct::Builder::getPointerSection(&local_980,&local_9a8);
  local_954[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_980);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_948,&local_94c,local_954);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_948);
  if (!bVar1) {
    local_9d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_9d1 != false) {
      local_9dc[1] = 0x14;
      AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                (&local_a58,(Builder *)auStack_7a8);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[](&local_a30,&local_a58,0);
      AnyStruct::Builder::getPointerSection(&local_a08,&local_a30);
      local_9dc[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_a08);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xca,ERROR,
                 "\"failed: expected \" \"(20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alb.as<List<AnyStruct>>()[0].getPointerSection().size()"
                 ,(char (*) [83])
                  "failed: expected (20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_948,(int *)(local_9dc + 1),local_9dc);
      local_9d1 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_9.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            (&local_aa8,(Builder *)&_kjCondition_9.result);
  AnyList::Builder::
  Builder<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>::Builder,void>
            ((Builder *)local_a80,&local_aa8);
  alb._builder.elementCount = local_a80._32_4_;
  alb._builder.step = local_a80._36_4_;
  alb._builder.capTable = (CapTableBuilder *)local_a80._16_8_;
  alb._builder.ptr = (byte *)local_a80._24_8_;
  auStack_7a8 = (undefined1  [8])local_a80._0_8_;
  alb._builder.segment = (SegmentBuilder *)local_a80._8_8_;
  iStack_ae8 = 2;
  local_ae4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff518);
  local_aec = AnyList::Builder::size((Builder *)auStack_7a8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_ae0,&local_ae4,&local_aec);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ae0);
  if (!bVar1) {
    local_aed = kj::_::Debug::shouldLog(ERROR);
    while (local_aed != false) {
      _kjCondition_10._36_4_ = 2;
      _kjCondition_10._32_4_ = AnyList::Builder::size((Builder *)auStack_7a8);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xce,ERROR,
                 "\"failed: expected \" \"(2) == (alb.size())\", _kjCondition, 2, alb.size()",
                 (char (*) [37])"failed: expected (2) == (alb.size())",
                 (DebugComparison<int,_unsigned_int> *)local_ae0,(int *)&_kjCondition_10.field_0x24,
                 (uint *)&_kjCondition_10.result);
      local_aed = false;
    }
  }
  local_b28 = 0x30;
  local_b24 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b28);
  AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_b90,(Builder *)auStack_7a8);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[](&local_b68,(Builder *)local_b90,0);
  local_b40 = AnyStruct::Builder::getDataSection(&local_b68);
  local_b30 = kj::ArrayPtr<unsigned_char>::size(&local_b40);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_b20,&local_b24,&local_b30);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b20);
  if (!bVar1) {
    local_b91 = kj::_::Debug::shouldLog(ERROR);
    while (local_b91 != false) {
      local_b98 = 0x30;
      AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&_kjCondition_11.result,
                 (Builder *)auStack_7a8);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[]
                (&local_bd8,(Builder *)&_kjCondition_11.result,0);
      AVar2 = AnyStruct::Builder::getDataSection(&local_bd8);
      local_bb0 = AVar2;
      local_ba0 = kj::ArrayPtr<unsigned_char>::size(&local_bb0);
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xcf,ERROR,
                 "\"failed: expected \" \"(48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alb.as<List<AnyStruct>>()[0].getDataSection().size()"
                 ,(char (*) [80])
                  "failed: expected (48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_b20,&local_b98,&local_ba0);
      local_b91 = false;
    }
  }
  local_c2c[1] = 0x14;
  local_c24 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_c2c + 1));
  AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((BuilderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_ca8,(Builder *)auStack_7a8);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[](&local_c80,(Builder *)local_ca8,0);
  AnyStruct::Builder::getPointerSection(&local_c58,&local_c80);
  local_c2c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_c58);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_c20,&local_c24,local_c2c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c20);
  if (!bVar1) {
    local_ca9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ca9 != false) {
      local_cb4[1] = 0x14;
      AnyList::Builder::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                (&local_d30,(Builder *)auStack_7a8);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Builder::operator[](&local_d08,&local_d30,0);
      AnyStruct::Builder::getPointerSection(&local_ce0,&local_d08);
      local_cb4[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Builder::size(&local_ce0);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xd0,ERROR,
                 "\"failed: expected \" \"(20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alb.as<List<AnyStruct>>()[0].getPointerSection().size()"
                 ,(char (*) [83])
                  "failed: expected (20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_c20,(int *)(local_cb4 + 1),local_cb4);
      local_ca9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_12.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            (&local_dc0,(Builder *)&_kjCondition_12.result);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::asReader
            (&local_d98,&local_dc0);
  toAny<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>::Reader>
            ((ReaderFor<AnyTypeFor<FromReader<Reader>_>_> *)auStack_d68,(capnp *)&local_d98,value_00
            );
  iStack_e00 = 2;
  local_dfc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff200);
  local_e04 = AnyList::Reader::size((Reader *)auStack_d68);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_df8,&local_dfc,&local_e04);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_df8);
  if (!bVar1) {
    local_e05 = kj::_::Debug::shouldLog(ERROR);
    while (local_e05 != false) {
      _kjCondition_13._36_4_ = 2;
      _kjCondition_13._32_4_ = AnyList::Reader::size((Reader *)auStack_d68);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xd4,ERROR,
                 "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
                 (char (*) [37])"failed: expected (2) == (alr.size())",
                 (DebugComparison<int,_unsigned_int> *)local_df8,(int *)&_kjCondition_13.field_0x24,
                 (uint *)&_kjCondition_13.result);
      local_e05 = false;
    }
  }
  local_e40 = 0x30;
  local_e3c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e40);
  AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_eb8,(Reader *)auStack_d68);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_e88,(Reader *)local_eb8,0);
  local_e58 = AnyStruct::Reader::getDataSection(&local_e88);
  local_e48 = kj::ArrayPtr<const_unsigned_char>::size(&local_e58);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_e38,&local_e3c,&local_e48);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e38);
  if (!bVar1) {
    local_eb9 = kj::_::Debug::shouldLog(ERROR);
    while (local_eb9 != false) {
      local_ec0 = 0x30;
      AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&_kjCondition_14.result,
                 (Reader *)auStack_d68);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[]
                (&local_f08,(Reader *)&_kjCondition_14.result,0);
      AVar3 = AnyStruct::Reader::getDataSection(&local_f08);
      local_ed8 = AVar3;
      local_ec8 = kj::ArrayPtr<const_unsigned_char>::size(&local_ed8);
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xd5,ERROR,
                 "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
                 ,(char (*) [80])
                  "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_e38,&local_ec0,&local_ec8);
      local_eb9 = false;
    }
  }
  local_f64[1] = 0x14;
  local_f5c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_f64 + 1));
  AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_ff8,(Reader *)auStack_d68);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_fc8,(Reader *)local_ff8,0);
  AnyStruct::Reader::getPointerSection(&local_f98,&local_fc8);
  local_f64[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_f98);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_f58,&local_f5c,local_f64);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f58);
  if (!bVar1) {
    local_ff9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ff9 != false) {
      local_1004[1] = 0x14;
      AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                (&local_1098,(Reader *)auStack_d68);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_1068,&local_1098,0);
      AnyStruct::Reader::getPointerSection(&local_1038,&local_1068);
      local_1004[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_1038);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xd6,ERROR,
                 "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
                 ,(char (*) [83])
                  "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_f58,(int *)(local_1004 + 1),local_1004
                );
      local_ff9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_15.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            (&local_1118,(Builder *)&_kjCondition_15.result);
  toAny<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>::Builder>
            (&local_10f0,(capnp *)&local_1118,value_01);
  AnyList::Builder::asReader((Reader *)local_10c8,&local_10f0);
  alr._reader.elementCount = local_10c8._32_4_;
  alr._reader.step = local_10c8._36_4_;
  alr._reader.structDataSize = local_10c8._40_4_;
  alr._reader.structPointerCount = local_10c8._44_2_;
  alr._reader.elementSize = local_10c8[0x2e];
  alr._reader._39_1_ = local_10c8[0x2f];
  alr._reader.capTable = (CapTableReader *)local_10c8._16_8_;
  alr._reader.ptr = (byte *)local_10c8._24_8_;
  auStack_d68 = (undefined1  [8])local_10c8._0_8_;
  alr._reader.segment = (SegmentReader *)local_10c8._8_8_;
  iStack_1158 = 2;
  local_1154 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffeea8);
  local_115c = AnyList::Reader::size((Reader *)auStack_d68);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_1150,&local_1154,&local_115c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1150);
  if (!bVar1) {
    local_115d = kj::_::Debug::shouldLog(ERROR);
    while (local_115d != false) {
      _kjCondition_16._36_4_ = 2;
      _kjCondition_16._32_4_ = AnyList::Reader::size((Reader *)auStack_d68);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xd9,ERROR,
                 "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
                 (char (*) [37])"failed: expected (2) == (alr.size())",
                 (DebugComparison<int,_unsigned_int> *)local_1150,(int *)&_kjCondition_16.field_0x24
                 ,(uint *)&_kjCondition_16.result);
      local_115d = false;
    }
  }
  local_1198 = 0x30;
  local_1194 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1198);
  AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_1210,(Reader *)auStack_d68);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_11e0,(Reader *)local_1210,0);
  local_11b0 = AnyStruct::Reader::getDataSection(&local_11e0);
  local_11a0 = kj::ArrayPtr<const_unsigned_char>::size(&local_11b0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_1190,&local_1194,&local_11a0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1190);
  if (!bVar1) {
    local_1211 = kj::_::Debug::shouldLog(ERROR);
    while (local_1211 != false) {
      local_1218 = 0x30;
      AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&_kjCondition_17.result,
                 (Reader *)auStack_d68);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[]
                (&local_1260,(Reader *)&_kjCondition_17.result,0);
      AVar3 = AnyStruct::Reader::getDataSection(&local_1260);
      local_1230 = AVar3;
      local_1220 = kj::ArrayPtr<const_unsigned_char>::size(&local_1230);
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xda,ERROR,
                 "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
                 ,(char (*) [80])
                  "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_1190,&local_1218,&local_1220);
      local_1211 = false;
    }
  }
  local_12bc[1] = 0x14;
  local_12b4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_12bc + 1));
  AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_1350,(Reader *)auStack_d68);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_1320,(Reader *)local_1350,0);
  AnyStruct::Reader::getPointerSection(&local_12f0,&local_1320);
  local_12bc[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_12f0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_12b0,&local_12b4,local_12bc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_12b0);
  if (!bVar1) {
    local_1351 = kj::_::Debug::shouldLog(ERROR);
    while (local_1351 != false) {
      local_135c[1] = 0x14;
      AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                (&local_13f0,(Reader *)auStack_d68);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_13c0,&local_13f0,0);
      AnyStruct::Reader::getPointerSection(&local_1390,&local_13c0);
      local_135c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_1390);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
                 ,(char (*) [83])
                  "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_12b0,(int *)(local_135c + 1),
                 local_135c);
      local_1351 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_18.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            (&local_1478,(Builder *)&_kjCondition_18.result);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::asReader
            (&local_1450,&local_1478);
  AnyList::Reader::
  Reader<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>::Reader,void>
            ((Reader *)local_1420,&local_1450);
  alr._reader.elementCount = local_1420._32_4_;
  alr._reader.step = local_1420._36_4_;
  alr._reader.structDataSize = local_1420._40_4_;
  alr._reader.structPointerCount = local_1420._44_2_;
  alr._reader.elementSize = local_1420[0x2e];
  alr._reader._39_1_ = local_1420[0x2f];
  alr._reader.capTable = (CapTableReader *)local_1420._16_8_;
  alr._reader.ptr = (byte *)local_1420._24_8_;
  auStack_d68 = (undefined1  [8])local_1420._0_8_;
  alr._reader.segment = (SegmentReader *)local_1420._8_8_;
  iStack_14b8 = 2;
  local_14b4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffeb48);
  local_14bc = AnyList::Reader::size((Reader *)auStack_d68);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_14b0,&local_14b4,&local_14bc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14b0);
  if (!bVar1) {
    local_14bd = kj::_::Debug::shouldLog(ERROR);
    while (local_14bd != false) {
      _kjCondition_19._36_4_ = 2;
      _kjCondition_19._32_4_ = AnyList::Reader::size((Reader *)auStack_d68);
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
                 (char (*) [37])"failed: expected (2) == (alr.size())",
                 (DebugComparison<int,_unsigned_int> *)local_14b0,(int *)&_kjCondition_19.field_0x24
                 ,(uint *)&_kjCondition_19.result);
      local_14bd = false;
    }
  }
  local_14f8 = 0x30;
  local_14f4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_14f8);
  AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_1570,(Reader *)auStack_d68);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_1540,(Reader *)local_1570,0);
  local_1510 = AnyStruct::Reader::getDataSection(&local_1540);
  local_1500 = kj::ArrayPtr<const_unsigned_char>::size(&local_1510);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_14f0,&local_14f4,&local_1500);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14f0);
  if (!bVar1) {
    local_1571 = kj::_::Debug::shouldLog(ERROR);
    while (local_1571 != false) {
      local_1578 = 0x30;
      AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&_kjCondition_20.result,
                 (Reader *)auStack_d68);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[]
                (&local_15c0,(Reader *)&_kjCondition_20.result,0);
      AVar3 = AnyStruct::Reader::getDataSection(&local_15c0);
      local_1590 = AVar3;
      local_1580 = kj::ArrayPtr<const_unsigned_char>::size(&local_1590);
      kj::_::Debug::
      log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xe0,ERROR,
                 "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
                 ,(char (*) [80])
                  "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
                 (DebugComparison<int,_unsigned_long> *)local_14f0,&local_1578,&local_1580);
      local_1571 = false;
    }
  }
  local_161c[1] = 0x14;
  local_1614 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_161c + 1));
  AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
            ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)local_16b0,(Reader *)auStack_d68);
  List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_1680,(Reader *)local_16b0,0);
  AnyStruct::Reader::getPointerSection(&local_1650,&local_1680);
  local_161c[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_1650);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_1610,&local_1614,local_161c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1610);
  if (!bVar1) {
    local_16b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_16b1 != false) {
      local_16bc[1] = 0x14;
      AnyList::Reader::as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                (&local_1750,(Reader *)auStack_d68);
      List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[](&local_1720,&local_1750,0);
      AnyStruct::Reader::getPointerSection(&local_16f0,&local_1720);
      local_16bc[0] = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size(&local_16f0);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
                 ,(char (*) [83])
                  "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
                 ,(DebugComparison<int,_unsigned_int> *)local_1610,(int *)(local_16bc + 1),
                 local_16bc);
      local_16b1 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Any, AnyList) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();
  List<TestAllTypes>::Builder b = root.getAnyPointerField().initAs<List<TestAllTypes>>(2);
  initTestMessage(b[0]);

  auto ptr = root.getAnyPointerField().getAs<AnyList>();

  EXPECT_EQ(2, ptr.size());
  EXPECT_EQ(48, ptr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, ptr.as<List<AnyStruct>>()[0].getPointerSection().size());

  auto readPtr = root.getAnyPointerField().asReader().getAs<AnyList>();

  EXPECT_EQ(2, readPtr.size());
  EXPECT_EQ(48, readPtr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, readPtr.as<List<AnyStruct>>()[0].getPointerSection().size());

  auto alb = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>());
  EXPECT_EQ(2, alb.size());
  EXPECT_EQ(48, alb.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alb.as<List<AnyStruct>>()[0].getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  alb = root.getAnyPointerField().getAs<List<TestAllTypes>>();
  EXPECT_EQ(2, alb.size());
  EXPECT_EQ(48, alb.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alb.as<List<AnyStruct>>()[0].getPointerSection().size());
#endif

  auto alr = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>().asReader());
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());

  alr = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>()).asReader();
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  alr = root.getAnyPointerField().getAs<List<TestAllTypes>>().asReader();
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());
#endif
}